

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O3

void __thiscall YAML::Emitter::SpaceOrIndentTo(Emitter *this,bool requireSpace,size_t indent)

{
  ostream_wrapper *this_00;
  ulong uVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined1 uVar2;
  undefined1 local_29;
  
  this_00 = &this->m_stream;
  if ((this->m_stream).m_comment == true) {
    ostream_wrapper::write(this_00,0x75cfd2,(void *)0x1,CONCAT71(in_register_00000009,in_CL));
  }
  uVar1 = (this->m_stream).m_col;
  uVar2 = uVar1 == 0;
  if (requireSpace && !(bool)uVar2) {
    ostream_wrapper::write(this_00,0x750b98,(void *)0x1,CONCAT71(in_register_00000009,uVar2));
    uVar1 = (this->m_stream).m_col;
  }
  if (uVar1 < indent) {
    do {
      local_29 = 0x20;
      ostream_wrapper::write
                (this_00,(int)&local_29,(void *)0x1,CONCAT71(in_register_00000009,uVar2));
    } while ((this->m_stream).m_col < indent);
  }
  return;
}

Assistant:

void Emitter::SpaceOrIndentTo(bool requireSpace, std::size_t indent) {
  if (m_stream.comment())
    m_stream << "\n";
  if (m_stream.col() > 0 && requireSpace)
    m_stream << " ";
  m_stream << IndentTo(indent);
}